

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::PathIntegrator::Li
          (PathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurf)

{
  Vector3f *pVVar1;
  float *pfVar2;
  uintptr_t uVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  LightSampleContext LVar10;
  LightSampleContext LVar11;
  LightSampleContext LVar12;
  LightSampleContext LVar13;
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined1 auVar21 [16];
  Vector3f wi;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  SamplerHandle *pSVar24;
  undefined8 uVar25;
  int i;
  int iVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  long lVar31;
  pointer pLVar32;
  long lVar33;
  ExhaustiveLightSampler *pEVar34;
  HaltonSampler *this_00;
  DebugMLTSampler *this_01;
  pointer pLVar35;
  ulong uVar36;
  long in_FS_OFFSET;
  bool bVar37;
  undefined1 auVar39 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar41 [48];
  undefined1 auVar40 [64];
  float fVar42;
  float fVar43;
  float fVar44;
  Float FVar45;
  float fVar60;
  SampledSpectrum ret;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar61 [56];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  Tuple2<pbrt::Point2,_float> u2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar58 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar59 [64];
  undefined4 uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar70 [56];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  SampledSpectrum ret_4;
  undefined1 auVar71 [16];
  undefined1 in_XMM5 [16];
  SampledSpectrum SVar72;
  Vector3f w;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f wiRender;
  Float f;
  SampledSpectrum ret_1;
  LightSampleContext prevIntrCtx;
  SampledSpectrum rrBeta;
  optional<pbrt::BSDFSample> bs;
  SampledSpectrum Le;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  uint local_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  float local_334;
  undefined8 local_328;
  RayDifferential *local_320;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_318;
  float local_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  SamplerHandle *local_2e0;
  LightSampleContext local_2d8;
  undefined1 local_2a8 [8];
  float afStack_2a0 [9];
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float fStack_260;
  undefined8 uStack_25c;
  undefined8 uStack_254;
  undefined8 local_240;
  Tuple3<pbrt::Vector3,_float> local_238;
  undefined4 uStack_22c;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined1 local_210;
  byte local_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  Float local_1f8;
  Float FStack_1f4;
  Float FStack_1f0;
  Float FStack_1ec;
  undefined1 local_1e8 [4];
  float afStack_1e4 [3];
  VisibleSurface *local_1d8;
  undefined1 local_1d0 [16];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  *local_1c0;
  Float local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  bool *local_188;
  ScratchBuffer *local_180;
  PrimitiveHandle *local_178;
  SamplerHandle local_170;
  SamplerHandle local_168;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_160;
  undefined1 local_158 [16];
  Float local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_138;
  ulong local_38;
  undefined1 auVar73 [28];
  undefined1 auVar38 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar65 [64];
  
  fStack_300 = 1.0;
  local_308 = (undefined1  [8])0x3f8000003f800000;
  fStack_2fc = 1.0;
  local_240 = 0;
  local_36c = 0;
  local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = 0.0;
  local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = 0.0;
  local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = 0.0;
  local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = 0.0;
  local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = 0.0;
  local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = 0.0;
  local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_178 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_188 = &ray->hasDifferentials;
  iVar26 = 0;
  local_158 = SUB6416(ZEXT464(0x3f800000),0);
  local_30c = 0.2;
  _local_2f8 = ZEXT816(0);
  local_320 = ray;
  local_2e0 = sampler;
  local_1d8 = visibleSurf;
  local_180 = scratchBuffer;
  do {
    *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
    iVar27 = iVar26;
    if (((local_178->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
      local_38 = 0;
      local_138._0_64_ = in_ZmmResult;
      local_138._64_64_ = in_ZmmResult;
      local_138._128_64_ = in_ZmmResult;
      local_138._192_64_ = in_ZmmResult;
LAB_003e2527:
      pLVar32 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                infiniteLights.
                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                super__Vector_impl_data._M_start;
      pLVar35 = *(pointer *)
                 ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                         infiniteLights.
                         super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                         _M_impl.super__Vector_impl_data + 8);
      bVar37 = true;
      if (pLVar32 != pLVar35) {
        local_208 = SUB84(pLVar35,0);
        fStack_204 = (float)((ulong)pLVar35 >> 0x20);
        do {
          auVar41 = in_ZmmResult._16_48_;
          uVar29 = (pLVar32->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          auVar38 = ZEXT816(0) << 0x40;
          auVar46 = ZEXT816(0) << 0x40;
          uVar28 = (uint)(ushort)(uVar29 >> 0x30);
          if (6 < uVar28) {
            uVar28 = uVar28 - 6;
            if (uVar28 < 2) {
              auVar61 = ZEXT856(0);
              auVar70 = ZEXT856(0);
              SVar72 = UniformInfiniteLight::Le
                                 ((UniformInfiniteLight *)(uVar29 & 0xffffffffffff),
                                  &local_320->super_Ray,lambda);
              auVar66._0_8_ = SVar72.values.values._8_8_;
              auVar66._8_56_ = auVar70;
              auVar46 = auVar66._0_16_;
              auVar53._0_8_ = SVar72.values.values._0_8_;
              auVar53._8_56_ = auVar61;
              auVar38 = auVar53._0_16_;
            }
            else if (uVar28 == 2) {
              auVar61 = ZEXT856(0);
              auVar70 = ZEXT856(0);
              SVar72 = ImageInfiniteLight::Le
                                 ((ImageInfiniteLight *)(uVar29 & 0xffffffffffff),
                                  &local_320->super_Ray,lambda);
              auVar67._0_8_ = SVar72.values.values._8_8_;
              auVar67._8_56_ = auVar70;
              auVar46 = auVar67._0_16_;
              auVar54._0_8_ = SVar72.values.values._0_8_;
              auVar54._8_56_ = auVar61;
              auVar38 = auVar54._0_16_;
            }
            else {
              auVar61 = ZEXT856(0);
              auVar70 = ZEXT856(0);
              SVar72 = PortalImageInfiniteLight::Le
                                 ((PortalImageInfiniteLight *)(uVar29 & 0xffffffffffff),
                                  &local_320->super_Ray,lambda);
              auVar68._0_8_ = SVar72.values.values._8_8_;
              auVar68._8_56_ = auVar70;
              auVar46 = auVar68._0_16_;
              auVar55._0_8_ = SVar72.values.values._0_8_;
              auVar55._8_56_ = auVar61;
              auVar38 = auVar55._0_16_;
            }
          }
          auVar38 = vmovlhps_avx(auVar38,auVar46);
          if (iVar26 == 0 || local_36c != 0) {
            auVar46._0_4_ = auVar38._0_4_ * (float)local_308._0_4_;
            auVar46._4_4_ = auVar38._4_4_ * (float)local_308._4_4_;
            auVar46._8_4_ = auVar38._8_4_ * fStack_300;
            auVar46._12_4_ = auVar38._12_4_ * fStack_2fc;
          }
          else {
            uVar3 = (pLVar32->
                    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    ).bits;
            uVar29 = (this->lightSampler).
                     super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                     .bits;
            pEVar34 = (ExhaustiveLightSampler *)(uVar29 & 0xffffffffffff);
            local_2a8._0_4_ = (undefined4)uVar3;
            local_2a8._4_4_ = (undefined4)(uVar3 >> 0x20);
            if (uVar29 < 0x3000000000000) {
              if ((uVar29 & 0x3000000000000) == 0x2000000000000) {
                fVar42 = PowerLightSampler::PDF
                                   ((PowerLightSampler *)pEVar34,&local_2d8,(LightHandle *)local_2a8
                                   );
              }
              else {
                sVar4 = (pEVar34->lights).nStored;
                auVar46 = vcvtusi2ss_avx512f(in_XMM5,sVar4);
                fVar42 = (float)((uint)(sVar4 != 0) * (int)(1.0 / auVar46._0_4_));
              }
            }
            else if ((uVar29 & 0xfffe000000000000) == 0x2000000000000) {
              fVar42 = BVHLightSampler::PDF
                                 ((BVHLightSampler *)pEVar34,&local_2d8,(LightHandle *)local_2a8);
            }
            else {
              fVar42 = ExhaustiveLightSampler::PDF(pEVar34,&local_2d8,(LightHandle *)local_2a8);
            }
            afStack_2a0[6] = local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.z;
            afStack_2a0[7] = local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
            afStack_2a0[8] = local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
            fStack_27c = local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
            local_1d0._0_8_ = local_2a8;
            local_2a8._0_4_ =
                 local_2d8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
            local_2a8._4_4_ =
                 local_2d8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
            afStack_2a0[0] =
                 local_2d8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
            afStack_2a0[1] =
                 local_2d8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
            afStack_2a0[2] =
                 local_2d8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
            afStack_2a0[3] =
                 local_2d8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
            afStack_2a0[4] = local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.x;
            afStack_2a0[5] = local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.y;
            pVVar1 = &(local_320->super_Ray).d;
            local_1d0._8_8_ = &local_238;
            local_318.bits = local_318.bits & 0xffffffff00000000;
            local_1c0 = &local_318;
            local_238 = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
            uVar29 = (pLVar32->
                     super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                     ).bits;
            uVar28 = (uint)(ushort)(uVar29 >> 0x30);
            if (uVar29 < 0x5000000000000) {
              pLVar35 = (pointer)CONCAT44(fStack_204,local_208);
              fVar43 = 0.0;
              if (0x2ffffffffffff < uVar29) {
                if ((uVar28 & 6) == 2) {
                  LVar10.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  y = local_2d8.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                  LVar10.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  x = local_2d8.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                  LVar10.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  z = local_2d8.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                  LVar10.n.super_Tuple3<pbrt::Normal3,_float>.x =
                       local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  LVar10.n.super_Tuple3<pbrt::Normal3,_float>.y =
                       local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  LVar10.n.super_Tuple3<pbrt::Normal3,_float>.z =
                       local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.z;
                  LVar10.ns.super_Tuple3<pbrt::Normal3,_float>.x =
                       local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                  LVar10.ns.super_Tuple3<pbrt::Normal3,_float>.y =
                       local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                  LVar10.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                       local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                  fVar43 = ProjectionLight::PDF_Li
                                     ((ProjectionLight *)(uVar29 & 0xffffffffffff),LVar10,
                                      (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
                }
                else {
                  LVar11.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  y = local_2d8.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                  LVar11.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  x = local_2d8.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                  LVar11.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  z = local_2d8.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                  LVar11.n.super_Tuple3<pbrt::Normal3,_float>.x =
                       local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  LVar11.n.super_Tuple3<pbrt::Normal3,_float>.y =
                       local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  LVar11.n.super_Tuple3<pbrt::Normal3,_float>.z =
                       local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.z;
                  LVar11.ns.super_Tuple3<pbrt::Normal3,_float>.x =
                       local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                  LVar11.ns.super_Tuple3<pbrt::Normal3,_float>.y =
                       local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                  LVar11.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                       local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                  fVar43 = GoniometricLight::PDF_Li
                                     ((GoniometricLight *)(uVar29 & 0xffffffffffff),LVar11,
                                      (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
                }
              }
            }
            else {
              _local_1e8 = uVar29;
              fVar43 = DispatchSplit<5>::operator()
                                 ((DispatchSplit<5> *)&local_328,local_1e8,uVar28 - 4);
              pLVar35 = (pointer)CONCAT44(fStack_204,local_208);
            }
            fVar42 = (local_334 * local_334) /
                     (local_334 * local_334 + fVar42 * fVar43 * fVar42 * fVar43);
            auVar46._0_4_ = fVar42 * (float)local_308._0_4_ * auVar38._0_4_;
            auVar46._4_4_ = fVar42 * (float)local_308._4_4_ * auVar38._4_4_;
            auVar46._8_4_ = fVar42 * fStack_300 * auVar38._8_4_;
            auVar46._12_4_ = fVar42 * fStack_2fc * auVar38._12_4_;
          }
          pLVar32 = pLVar32 + 1;
          auVar38 = *(undefined1 (*) [16])(lambda->pdf).values;
          uVar29 = vcmpps_avx512vl(auVar38,_DAT_0054e010,4);
          auVar38 = vdivps_avx512vl(auVar46,auVar38);
          fVar42 = (float)((uint)((byte)uVar29 & 1) * auVar38._0_4_);
          fVar60 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar38._4_4_);
          in_ZmmResult._4_4_ = fVar60;
          in_ZmmResult._0_4_ = fVar42;
          fVar44 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar38._8_4_);
          in_ZmmResult._8_4_ = fVar44;
          fVar43 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar38._12_4_);
          in_ZmmResult._12_4_ = fVar43;
          in_ZmmResult._16_48_ = auVar41;
          local_2f8._0_4_ = fVar42 + (float)local_2f8._0_4_;
          local_2f8._4_4_ = fVar60 + (float)local_2f8._4_4_;
          fStack_2f0 = fVar44 + fStack_2f0;
          fStack_2ec = fVar43 + fStack_2ec;
        } while (pLVar32 != pLVar35);
        bVar37 = true;
        ray = local_320;
      }
    }
    else {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_138.__align,local_178,&ray->super_Ray,
                 INFINITY);
      if ((local_38 & 1) == 0) goto LAB_003e2527;
      auVar63._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar63._4_4_ = 0x80000000;
      auVar63._8_4_ = 0x80000000;
      auVar63._12_4_ = 0x80000000;
      uVar29._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar29._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar38._0_8_ = uVar29 ^ 0x8000000080000000;
      auVar38._8_4_ = 0x80000000;
      auVar38._12_4_ = 0x80000000;
      w.super_Tuple3<pbrt::Vector3,_float>.z = auVar63._0_4_;
      w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar38._0_8_;
      w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar38._0_8_ >> 0x20);
      auVar70 = ZEXT856(auVar63._8_8_);
      auVar61 = ZEXT856(auVar38._8_8_);
      SVar72 = SurfaceInteraction::Le((SurfaceInteraction *)&local_138.__align,w,lambda);
      auVar55 = local_138._192_64_;
      auVar41 = in_ZmmResult._16_48_;
      auVar65._0_8_ = SVar72.values.values._8_8_;
      auVar65._8_56_ = auVar70;
      auVar56._0_8_ = SVar72.values.values._0_8_;
      auVar56._8_56_ = auVar61;
      _local_1e8 = vmovlhps_avx(auVar56._0_16_,auVar65._0_16_);
      if ((SVar72.values.values[0] != 0.0) || (NAN(SVar72.values.values[0]))) {
LAB_003e24d7:
        if ((iVar26 == 0) || (local_36c != 0)) {
          fVar42 = (float)local_308._0_4_;
          fVar43 = (float)local_308._4_4_;
          fVar60 = fStack_300;
          fVar44 = fStack_2fc;
        }
        else {
          if ((char)local_38 == '\0') goto LAB_003e3737;
          uVar29 = (this->lightSampler).
                   super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                   .bits;
          uVar25 = local_138._200_8_;
          pEVar34 = (ExhaustiveLightSampler *)(uVar29 & 0xffffffffffff);
          local_2a8._0_4_ = local_138._200_4_;
          local_2a8._4_4_ = local_138._204_4_;
          if (uVar29 < 0x3000000000000) {
            if ((uVar29 & 0x3000000000000) == 0x2000000000000) {
              fVar42 = PowerLightSampler::PDF
                                 ((PowerLightSampler *)pEVar34,&local_2d8,(LightHandle *)local_2a8);
            }
            else {
              sVar4 = (pEVar34->lights).nStored;
              auVar38 = vcvtusi2ss_avx512f(in_XMM5,sVar4);
              fVar42 = (float)((uint)(sVar4 != 0) * (int)(1.0 / auVar38._0_4_));
            }
          }
          else if ((uVar29 & 0xfffe000000000000) == 0x2000000000000) {
            fVar42 = BVHLightSampler::PDF
                               ((BVHLightSampler *)pEVar34,&local_2d8,(LightHandle *)local_2a8);
          }
          else {
            fVar42 = ExhaustiveLightSampler::PDF(pEVar34,&local_2d8,(LightHandle *)local_2a8);
          }
          local_1d0._0_8_ = local_2a8;
          local_1d0._8_8_ = &local_238;
          afStack_2a0[6] = local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.z;
          afStack_2a0[7] = local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
          afStack_2a0[8] = local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
          fStack_27c = local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
          local_2a8._0_4_ =
               local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               x.low;
          local_2a8._4_4_ =
               local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               x.high;
          afStack_2a0[0] =
               local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               y.low;
          afStack_2a0[1] =
               local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               y.high;
          afStack_2a0[2] =
               local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               z.low;
          afStack_2a0[3] =
               local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               z.high;
          afStack_2a0[4] = local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.x;
          afStack_2a0[5] = local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.y;
          pVVar1 = &(ray->super_Ray).d;
          local_1c0 = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       *)&local_328;
          local_328._0_4_ = 0;
          local_238 = pVVar1->super_Tuple3<pbrt::Vector3,_float>;
          if ((ulong)uVar25 < 0x5000000000000) {
            fVar43 = 0.0;
            if (0x2ffffffffffff < (ulong)uVar25) {
              if ((auVar55._14_2_ & 6) == 2) {
                LVar12.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                     = local_2d8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                LVar12.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                     = local_2d8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                LVar12.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                     = local_2d8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                LVar12.n.super_Tuple3<pbrt::Normal3,_float>.x =
                     local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                LVar12.n.super_Tuple3<pbrt::Normal3,_float>.y =
                     local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                LVar12.n.super_Tuple3<pbrt::Normal3,_float>.z =
                     local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.z;
                LVar12.ns.super_Tuple3<pbrt::Normal3,_float>.x =
                     local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                LVar12.ns.super_Tuple3<pbrt::Normal3,_float>.y =
                     local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                LVar12.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                     local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                fVar43 = ProjectionLight::PDF_Li
                                   ((ProjectionLight *)(uVar25 & 0xffffffffffff),LVar12,
                                    (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
              }
              else {
                LVar13.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                     = local_2d8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                LVar13.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                     = local_2d8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                LVar13.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                     = local_2d8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                LVar13.n.super_Tuple3<pbrt::Normal3,_float>.x =
                     local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                LVar13.n.super_Tuple3<pbrt::Normal3,_float>.y =
                     local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                LVar13.n.super_Tuple3<pbrt::Normal3,_float>.z =
                     local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.z;
                LVar13.ns.super_Tuple3<pbrt::Normal3,_float>.x =
                     local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                LVar13.ns.super_Tuple3<pbrt::Normal3,_float>.y =
                     local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                LVar13.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                     local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                fVar43 = GoniometricLight::PDF_Li
                                   ((GoniometricLight *)(uVar25 & 0xffffffffffff),LVar13,
                                    (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
              }
            }
          }
          else {
            local_318.bits = uVar25;
            fVar43 = DispatchSplit<5>::operator()
                               ((DispatchSplit<5> *)((long)&local_328 + 7),&local_318,
                                auVar55._14_2_ - 4);
          }
          fVar44 = (local_334 * local_334) /
                   (local_334 * local_334 + fVar42 * fVar43 * fVar42 * fVar43);
          fVar42 = fVar44 * (float)local_308._0_4_;
          fVar43 = fVar44 * (float)local_308._4_4_;
          fVar60 = fVar44 * fStack_300;
          fVar44 = fVar44 * fStack_2fc;
        }
        auVar47._0_4_ = fVar42 * (float)local_1e8;
        auVar47._4_4_ = fVar43 * afStack_1e4[0];
        auVar47._8_4_ = fVar60 * afStack_1e4[1];
        auVar47._12_4_ = fVar44 * afStack_1e4[2];
        auVar38 = *(undefined1 (*) [16])(lambda->pdf).values;
        uVar29 = vcmpps_avx512vl(auVar38,_DAT_0054e010,4);
        auVar38 = vdivps_avx512vl(auVar47,auVar38);
        fVar42 = (float)((uint)((byte)uVar29 & 1) * auVar38._0_4_);
        fVar43 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar38._4_4_);
        auVar39._4_4_ = fVar43;
        auVar39._0_4_ = fVar42;
        fVar60 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar38._8_4_);
        auVar39._8_4_ = fVar60;
        fVar44 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar38._12_4_);
        auVar39._12_4_ = fVar44;
        uVar36 = auVar39._8_8_;
        in_ZmmResult._16_48_ = auVar41;
        in_ZmmResult._0_16_ = auVar39;
        local_2f8._0_4_ = fVar42 + (float)local_2f8._0_4_;
        local_2f8._4_4_ = fVar43 + (float)local_2f8._4_4_;
        fStack_2f0 = fVar60 + fStack_2f0;
        fStack_2ec = fVar44 + fStack_2ec;
      }
      else {
        uVar29 = 0xffffffffffffffff;
        do {
          uVar36 = auVar56._8_8_;
          if (uVar29 == 2) goto LAB_003e2c54;
          fVar42 = *(float *)(local_1e8 + uVar29 * 4 + 8);
          auVar56 = ZEXT464((uint)fVar42);
          uVar36 = 0;
          uVar29 = uVar29 + 1;
        } while ((fVar42 == 0.0) && (!NAN(fVar42)));
        if (uVar29 < 3) goto LAB_003e24d7;
      }
LAB_003e2c54:
      if ((char)local_38 == '\0') {
LAB_003e3737:
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
      }
      local_160.bits =
           (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_168.
      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
      .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               )(local_2e0->
                super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
      SurfaceInteraction::GetBSDF
                ((BSDF *)local_1d0,(SurfaceInteraction *)&local_138.__align,ray,lambda,
                 (CameraHandle *)&local_160,local_180,&local_168);
      if ((local_1d0._0_8_ & 0xffffffffffff) == 0) {
        if ((char)local_38 == '\0') goto LAB_003e3737;
        SurfaceInteraction::SkipIntersection
                  ((SurfaceInteraction *)&local_138.__align,ray,(Float)local_138._248_4_);
        bVar37 = false;
      }
      else {
        uVar29 = 0;
        if (iVar26 == 0 && local_1d8 != (VisibleSurface *)0x0) {
          uVar36 = 0;
          _local_368 = ZEXT816(0);
          do {
            fVar42 = 1.0;
            uVar36 = uVar36 + 1;
            lVar33 = 0;
            uVar29 = uVar36;
            do {
              fVar42 = fVar42 * 0.5;
              lVar33 = (lVar33 - uVar29 / 2) * 2 + uVar29;
              bVar37 = 1 < uVar29;
              uVar29 = uVar29 / 2;
            } while (bVar37);
            auVar38 = vcvtusi2ss_avx512f(in_XMM5,lVar33);
            lVar33 = 0;
            fVar43 = 1.0;
            uVar29 = uVar36;
            do {
              fVar43 = fVar43 * 0.33333334;
              lVar33 = (lVar33 - uVar29 / 3) * 3 + uVar29;
              bVar37 = 2 < uVar29;
              uVar29 = uVar29 / 3;
            } while (bVar37);
            auVar46 = vcvtusi2ss_avx512f(in_XMM5,lVar33);
            lVar33 = 0;
            fVar60 = 1.0;
            uVar29 = uVar36;
            do {
              fVar60 = local_30c * fVar60;
              lVar33 = (lVar33 - uVar29 / 5) * 5 + uVar29;
              bVar37 = 4 < uVar29;
              uVar29 = uVar29 / 5;
            } while (bVar37);
            if ((char)local_38 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
            }
            auVar63 = vcvtusi2ss_avx512f(in_XMM5,lVar33);
            auVar39 = SUB6416(ZEXT464(0x3f7fffff),0);
            auVar46 = vminss_avx(auVar39,ZEXT416((uint)(fVar43 * auVar46._0_4_)));
            auVar63 = vminss_avx(auVar39,ZEXT416((uint)(fVar60 * auVar63._0_4_)));
            auVar46 = vinsertps_avx(auVar46,auVar63,0x10);
            auVar38 = vminss_avx(auVar39,ZEXT416((uint)(fVar42 * auVar38._0_4_)));
            BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_2a8,(BSDF *)local_1d0,
                           (Vector3f)local_138._28_12_,auVar38._0_4_,(Point2f)auVar46._0_8_,Radiance
                           ,All);
            if (fStack_27c._0_1_ == true) {
              if ((char)local_38 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
              }
              auVar38 = vfmadd132ss_fma(ZEXT416((uint)local_138._132_4_),
                                        ZEXT416((uint)((float)local_138._136_4_ * afStack_2a0[4])),
                                        ZEXT416((uint)afStack_2a0[3]));
              auVar46 = vfmsub213ss_fma(ZEXT416((uint)afStack_2a0[4]),
                                        ZEXT416((uint)local_138._136_4_),
                                        ZEXT416((uint)((float)local_138._136_4_ * afStack_2a0[4])));
              auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ + auVar46._0_4_)),
                                        ZEXT416((uint)local_138._128_4_),
                                        ZEXT416((uint)afStack_2a0[2]));
              uVar62 = auVar38._0_4_;
              auVar48._4_4_ = uVar62;
              auVar48._0_4_ = uVar62;
              auVar48._8_4_ = uVar62;
              auVar48._12_4_ = uVar62;
              auVar5._8_4_ = 0x7fffffff;
              auVar5._0_8_ = 0x7fffffff7fffffff;
              auVar5._12_4_ = 0x7fffffff;
              auVar38 = vandps_avx512vl(auVar48,auVar5);
              auVar49._0_4_ = auVar38._0_4_ * (float)local_2a8._0_4_;
              auVar49._4_4_ = auVar38._4_4_ * (float)local_2a8._4_4_;
              auVar49._8_4_ = auVar38._8_4_ * afStack_2a0[0];
              auVar49._12_4_ = auVar38._12_4_ * afStack_2a0[1];
              auVar6._4_4_ = afStack_2a0[5];
              auVar6._0_4_ = afStack_2a0[5];
              auVar6._8_4_ = afStack_2a0[5];
              auVar6._12_4_ = afStack_2a0[5];
              auVar38 = vdivps_avx512vl(auVar49,auVar6);
              local_368._4_4_ = auVar38._4_4_ + (float)local_368._4_4_;
              local_368._0_4_ = auVar38._0_4_ + (float)local_368._0_4_;
              fStack_360 = auVar38._8_4_ + fStack_360;
              fStack_35c = auVar38._12_4_ + fStack_35c;
            }
            uVar29 = 0;
          } while (uVar36 != 0x10);
          auVar7._8_4_ = 0x3d800000;
          auVar7._0_8_ = 0x3d8000003d800000;
          auVar7._12_4_ = 0x3d800000;
          _local_238 = vmulps_avx512vl(_local_368,auVar7);
          if ((char)local_38 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
          }
          VisibleSurface::VisibleSurface
                    ((VisibleSurface *)local_2a8,(SurfaceInteraction *)&local_138.__align,
                     (CameraTransform *)
                     ((this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits & 0xffffffffffff),
                     (SampledSpectrum *)
                     &((aligned_storage_t<sizeof(pbrt::BSDFSample),_alignof(pbrt::BSDFSample)> *)
                      &local_238)->__align,lambda);
          (local_1d8->albedo).values.values[3] = fStack_268;
          auVar21._4_4_ = local_2a8._4_4_;
          auVar21._0_4_ = local_2a8._0_4_;
          auVar21._8_4_ = afStack_2a0[0];
          auVar21._12_4_ = afStack_2a0[1];
          uVar15 = afStack_2a0[2];
          auVar14 = auVar21;
          auVar73._16_4_ = uVar15;
          auVar73._0_16_ = auVar14;
          uVar16 = afStack_2a0[3];
          auVar73._20_4_ = uVar16;
          uVar17 = afStack_2a0[4];
          auVar73._24_4_ = uVar17;
          uVar18 = afStack_2a0[5];
          in_ZmmResult._28_4_ = uVar18;
          in_ZmmResult._0_28_ = auVar73;
          uVar19 = afStack_2a0[6];
          in_ZmmResult._32_4_ = uVar19;
          uVar20 = afStack_2a0[7];
          in_ZmmResult._36_4_ = uVar20;
          in_ZmmResult._40_4_ = afStack_2a0[8];
          in_ZmmResult._44_4_ = fStack_27c;
          in_ZmmResult._48_4_ = fStack_278;
          in_ZmmResult._52_4_ = fStack_274;
          in_ZmmResult._56_4_ = fStack_270;
          in_ZmmResult._60_4_ = fStack_26c;
          uVar36 = auVar21._8_8_;
          local_1d8->set = (bool)(char)local_2a8._0_4_;
          *(int3 *)&local_1d8->field_0x1 = SUB43(local_2a8._0_4_,1);
          local_1d8->p = (Point3f)auVar21._4_12_;
          local_1d8->n = (Normal3f)auVar73._16_12_;
          local_1d8->ns = (Normal3f)in_ZmmResult._28_12_;
          local_1d8->time = afStack_2a0[8];
          local_1d8->dzdx = fStack_27c;
          local_1d8->dzdy = fStack_278;
          (local_1d8->albedo).values.values[0] = fStack_274;
          (local_1d8->albedo).values.values[1] = fStack_270;
          (local_1d8->albedo).values.values[2] = fStack_26c;
        }
        iVar27 = iVar26 + 1;
        bVar37 = true;
        if (iVar26 != this->maxDepth) {
          if ((this->regularize & (byte)local_240) == 1) {
            *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
            BSDF::Regularize((BSDF *)local_1d0);
          }
          *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
          auVar61 = ZEXT856(uVar36);
          auVar70 = ZEXT856(uVar29);
          bVar37 = BSDF::IsNonSpecular((BSDF *)local_1d0);
          auVar41 = in_ZmmResult._16_48_;
          if (bVar37) {
            *(long *)(in_FS_OFFSET + -0x290) = *(long *)(in_FS_OFFSET + -0x290) + 1;
            local_170.
            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     )(local_2e0->
                      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
            SVar72 = SampleLd(this,(SurfaceInteraction *)&local_138.__align,(BSDF *)local_1d0,lambda
                              ,&local_170);
            auVar69._0_8_ = SVar72.values.values._8_8_;
            auVar69._8_56_ = auVar70;
            auVar57._0_8_ = SVar72.values.values._0_8_;
            auVar57._8_56_ = auVar61;
            auVar38 = vmovlhps_avx(auVar57._0_16_,auVar69._0_16_);
            local_2a8._0_4_ = auVar38._0_4_;
            local_2a8._4_4_ = auVar38._4_4_;
            afStack_2a0[0] = auVar38._8_4_;
            afStack_2a0[1] = auVar38._12_4_;
            if ((SVar72.values.values[0] == 0.0) && (!NAN(SVar72.values.values[0]))) {
              uVar29 = 0xffffffffffffffff;
              do {
                if (uVar29 == 2) goto LAB_003e302f;
                pfVar2 = afStack_2a0 + uVar29;
                uVar29 = uVar29 + 1;
              } while ((*pfVar2 == 0.0) && (!NAN(*pfVar2)));
              if (2 < uVar29) {
LAB_003e302f:
                *(long *)(in_FS_OFFSET + -0x288) = *(long *)(in_FS_OFFSET + -0x288) + 1;
              }
            }
            auVar50._0_4_ = (float)local_308._0_4_ * (float)local_2a8._0_4_;
            auVar50._4_4_ = (float)local_308._4_4_ * (float)local_2a8._4_4_;
            auVar50._8_4_ = fStack_300 * afStack_2a0[0];
            auVar50._12_4_ = fStack_2fc * afStack_2a0[1];
            auVar38 = *(undefined1 (*) [16])(lambda->pdf).values;
            uVar29 = vcmpps_avx512vl(auVar38,_DAT_0054e010,4);
            auVar38 = vdivps_avx512vl(auVar50,auVar38);
            fVar60 = (float)((uint)((byte)uVar29 & 1) * auVar38._0_4_);
            fVar43 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar38._4_4_);
            in_ZmmResult._4_4_ = fVar43;
            in_ZmmResult._0_4_ = fVar60;
            fVar42 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar38._8_4_);
            in_ZmmResult._8_4_ = fVar42;
            fVar44 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar38._12_4_);
            in_ZmmResult._12_4_ = fVar44;
            in_ZmmResult._16_48_ = auVar41;
            local_2f8._4_4_ = fVar43 + (float)local_2f8._4_4_;
            local_2f8._0_4_ = fVar60 + (float)local_2f8._0_4_;
            fStack_2f0 = fVar42 + fStack_2f0;
            fStack_2ec = fVar44 + fStack_2ec;
          }
          pSVar24 = local_2e0;
          uVar36._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar36._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          uVar29 = (local_2e0->
                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          fVar42 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_2a8._0_4_ = (undefined4)uVar29;
          local_2a8._4_4_ = (undefined4)(uVar29 >> 0x20);
          local_208 = DispatchSplit<9>::operator()
                                ((DispatchSplit<9> *)&local_238,local_2a8,uVar29 >> 0x30);
          uVar29 = (pSVar24->
                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          uVar9 = (ushort)(uVar29 >> 0x30);
          uVar28 = (uint)uVar9;
          if (uVar29 < 0x5000000000000) {
            if (uVar29 < 0x3000000000000) {
              if (uVar28 == 2) {
                u2 = (Tuple2<pbrt::Point2,_float>)
                     StratifiedSampler::Get2D((StratifiedSampler *)(uVar29 & 0xffffffffffff));
              }
              else {
                u2 = (Tuple2<pbrt::Point2,_float>)
                     RandomSampler::Get2D((RandomSampler *)(uVar29 & 0xffffffffffff));
              }
            }
            else {
              this_00 = (HaltonSampler *)(uVar29 & 0xffffffffffff);
              if ((uVar28 & 6) == 2) {
                local_198 = (Float)this_00->dimension;
                if (0x3e6 < this_00->dimension) {
                  local_198 = 2.8026e-45;
                }
                this_00->dimension = (int)local_198 + 2;
                uStack_194 = 0;
                local_1f8 = SUB84(this_00,0);
                FStack_1f4 = (Float)((ulong)this_00 >> 0x20);
                local_148 = HaltonSampler::SampleDimension(this_00,(int)local_198);
                uStack_144 = extraout_XMM0_Db;
                uStack_140 = extraout_XMM0_Dc;
                uStack_13c = extraout_XMM0_Dd;
                auVar58._0_4_ =
                     HaltonSampler::SampleDimension
                               ((HaltonSampler *)CONCAT44(FStack_1f4,local_1f8),(int)local_198 + 1);
                auVar58._4_60_ = extraout_var;
                auVar38 = auVar58._0_16_;
                auVar64._4_4_ = uStack_144;
                auVar64._0_4_ = local_148;
                auVar64._8_4_ = uStack_140;
                auVar64._12_4_ = uStack_13c;
LAB_003e367b:
                auVar38 = vinsertps_avx(auVar64,auVar38,0x10);
                u2 = auVar38._0_8_;
              }
              else {
                u2 = (Tuple2<pbrt::Point2,_float>)
                     PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_00);
              }
            }
          }
          else {
            uVar30 = uVar9 - 4;
            if (uVar30 < 3) {
              if (uVar30 == 2) {
                u2 = (Tuple2<pbrt::Point2,_float>)
                     ZSobolSampler::Get2D((ZSobolSampler *)(uVar29 & 0xffffffffffff));
              }
              else {
                u2 = (Tuple2<pbrt::Point2,_float>)
                     SobolSampler::Get2D((SobolSampler *)(uVar29 & 0xffffffffffff));
              }
            }
            else if (uVar28 - 6 < 2) {
              u2 = (Tuple2<pbrt::Point2,_float>)
                   PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar29 & 0xffffffffffff));
            }
            else {
              this_01 = (DebugMLTSampler *)(uVar29 & 0xffffffffffff);
              if (uVar28 - 6 != 2) {
                local_1f8 = SUB84(this_01,0);
                FStack_1f4 = (Float)((ulong)this_01 >> 0x20);
                local_198 = DebugMLTSampler::Get1D(this_01);
                uStack_194 = extraout_XMM0_Db_00;
                uStack_190 = extraout_XMM0_Dc_00;
                uStack_18c = extraout_XMM0_Dd_00;
                auVar59._0_4_ =
                     DebugMLTSampler::Get1D((DebugMLTSampler *)CONCAT44(FStack_1f4,local_1f8));
                auVar59._4_60_ = extraout_var_00;
                auVar38 = auVar59._0_16_;
                auVar64._4_4_ = uStack_194;
                auVar64._0_4_ = local_198;
                auVar64._8_4_ = uStack_190;
                auVar64._12_4_ = uStack_18c;
                goto LAB_003e367b;
              }
              u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)this_01);
            }
          }
          woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar36 ^ 0x8000000080000000;
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = -fVar42;
          woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = -fVar42;
          BSDF::Sample_f((optional<pbrt::BSDFSample> *)
                         &((aligned_storage_t<sizeof(pbrt::BSDFSample),_alignof(pbrt::BSDFSample)> *
                           )&local_238)->__align,(BSDF *)local_1d0,woRender,local_208,(Point2f)u2,
                         Radiance,All);
          bVar37 = true;
          if (local_20c != 0) {
            auVar38 = vfmadd132ss_fma(ZEXT416((uint)local_138._132_4_),
                                      ZEXT416((uint)((float)local_138._136_4_ * (float)local_220)),
                                      ZEXT416((uint)uStack_224));
            auVar46 = vfmsub213ss_fma(ZEXT416((uint)local_138._136_4_),ZEXT416((uint)local_220),
                                      ZEXT416((uint)((float)local_138._136_4_ * (float)local_220)));
            auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ + auVar46._0_4_)),
                                      ZEXT416((uint)local_138._128_4_),ZEXT416((uint)local_228));
            uVar62 = auVar38._0_4_;
            auVar51._4_4_ = uVar62;
            auVar51._0_4_ = uVar62;
            auVar51._8_4_ = uVar62;
            auVar51._12_4_ = uVar62;
            auVar8._8_4_ = 0x7fffffff;
            auVar8._0_8_ = 0x7fffffff7fffffff;
            auVar8._12_4_ = 0x7fffffff;
            auVar41 = in_ZmmResult._16_48_;
            auVar38 = vandps_avx512vl(auVar51,auVar8);
            local_208 = auVar38._0_4_ * local_238.x;
            fStack_204 = auVar38._4_4_ * local_238.y;
            fStack_200 = auVar38._8_4_ * local_238.z;
            fStack_1fc = auVar38._12_4_ * (float)uStack_22c;
            local_1f8 = (Float)local_21c;
            FStack_1f4 = (Float)local_21c;
            FStack_1f0 = (Float)local_21c;
            FStack_1ec = (Float)local_21c;
            if (local_210 == '\x01') {
              wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_224;
              wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_228;
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.x =
                   (float)(int)woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
                   (float)(int)(woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
              wiRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_220;
              local_334 = BSDF::PDF((BSDF *)local_1d0,woRender_00,wiRender,Radiance,All);
            }
            else {
              local_334 = (float)local_21c;
            }
            auVar55 = local_138._0_64_;
            uVar62 = local_214;
            if ((local_20c & 1) == 0) {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
            }
            uVar28 = local_218 & 0x10;
            bVar37 = (local_218 & 2) == 0;
            if ((char)local_38 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
            }
            afStack_2a0[2] = local_138._16_4_;
            afStack_2a0[3] = local_138._20_4_;
            local_2a8._0_4_ = local_138._0_4_;
            local_2a8._4_4_ = local_138._4_4_;
            afStack_2a0[0] = local_138._8_4_;
            afStack_2a0[1] = local_138._12_4_;
            afStack_2a0[6] = (float)local_138._48_4_;
            afStack_2a0[4] = local_138._40_4_;
            afStack_2a0[5] = local_138._44_4_;
            fStack_27c = (float)local_138._136_4_;
            afStack_2a0[7] = local_138._128_4_;
            afStack_2a0[8] = local_138._132_4_;
            local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
                 (Interval)local_138.__align;
            local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
            low = (Float)local_138._8_4_;
            local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
            high = (Float)local_138._12_4_;
            local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>.x = afStack_2a0[7];
            local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_138._48_4_;
            local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
            low = (Float)local_138._16_4_;
            local_2d8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
            high = (Float)local_138._20_4_;
            local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_138._40_4_;
            local_2d8.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_138._44_4_;
            local_2d8.ns.super_Tuple3<pbrt::Normal3,_float>._4_8_ = local_138._132_8_;
            wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_224;
            wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_228;
            wi.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_220;
            local_138._0_64_ = auVar55;
            SurfaceInteraction::SpawnRay
                      ((RayDifferential *)local_2a8,(SurfaceInteraction *)&local_138.__align,ray,
                       (BSDF *)local_1d0,wi,local_218,(Float)local_214);
            auVar22._4_4_ = fStack_204;
            auVar22._0_4_ = local_208;
            auVar22._8_4_ = fStack_200;
            auVar22._12_4_ = fStack_1fc;
            local_36c = uVar28 >> 4;
            auVar23._4_4_ = FStack_1f4;
            auVar23._0_4_ = local_1f8;
            auVar23._8_4_ = FStack_1f0;
            auVar23._12_4_ = FStack_1ec;
            auVar38 = vdivps_avx(auVar22,auVar23);
            local_240 = CONCAT71((int7)((ulong)local_240 >> 8),(byte)local_240 | uVar28 == 0);
            local_308._0_4_ = auVar38._0_4_ * (float)local_308._0_4_;
            local_308._4_4_ = auVar38._4_4_ * (float)local_308._4_4_;
            fStack_300 = auVar38._8_4_ * fStack_300;
            fStack_2fc = auVar38._12_4_ * fStack_2fc;
            fVar42 = (float)local_158._0_4_ * (float)uVar62 * (float)uVar62;
            auVar40._16_48_ = auVar41;
            auVar40._0_16_ = ZEXT416((uint)fVar42);
            in_ZmmResult._4_60_ = auVar40._4_60_;
            in_ZmmResult._0_4_ =
                 (float)((uint)bVar37 * local_158._0_4_ + (uint)!bVar37 * (int)fVar42);
            local_158 = in_ZmmResult._0_16_;
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = afStack_2a0[1];
            (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = afStack_2a0[2];
            *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                 CONCAT44(afStack_2a0[4],afStack_2a0[3]);
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_2a8._0_4_;
            (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_2a8._4_4_;
            *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(afStack_2a0[1],afStack_2a0[0]);
            (ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = CONCAT44(afStack_2a0[7],afStack_2a0[6]);
            *(ulong *)(local_188 + 0x14) = CONCAT44(fStack_268,fStack_26c);
            (((Vector3f *)(local_188 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).x = fStack_264;
            (((Vector3f *)(local_188 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).y = fStack_260;
            *(undefined8 *)(local_188 + 0x24) = uStack_25c;
            *(undefined8 *)(local_188 + 0x2c) = uStack_254;
            *(ulong *)local_188 = CONCAT44(fStack_27c,afStack_2a0[8]);
            *(undefined8 *)(local_188 + 8) = _fStack_278;
            (((Point3f *)(local_188 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x = fStack_270;
            (((Point3f *)(local_188 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y = fStack_26c;
            *(ulong *)(local_188 + 0x18) = CONCAT44(fStack_264,fStack_268);
            lVar33 = 1;
            auVar71._0_4_ =
                 (anon_struct_4_0_00000001_for___align)(in_ZmmResult._0_4_ * (float)local_308._0_4_)
            ;
            auVar71._4_4_ = in_ZmmResult._0_4_ * (float)local_308._4_4_;
            auVar71._8_4_ = in_ZmmResult._0_4_ * fStack_300;
            auVar71._12_4_ = in_ZmmResult._0_4_ * fStack_2fc;
            local_2a8._4_4_ = auVar71._4_4_;
            afStack_2a0[0] = auVar71._8_4_;
            afStack_2a0[1] = auVar71._12_4_;
            auVar38 = auVar71;
            do {
              lVar31 = lVar33 * 4;
              lVar33 = lVar33 + 1;
              auVar38 = vmaxss_avx(ZEXT416(*(uint *)(local_2a8 + lVar31)),auVar38);
            } while (lVar33 != 4);
            local_2a8._0_4_ = auVar71._0_4_;
            if (0 < iVar26 && auVar38._0_4_ < 1.0) {
              lVar33 = 1;
              auVar38 = auVar71;
              do {
                lVar31 = lVar33 * 4;
                lVar33 = lVar33 + 1;
                auVar38 = vmaxss_avx(ZEXT416(*(uint *)(local_2a8 + lVar31)),auVar38);
              } while (lVar33 != 4);
              local_318.bits =
                   (local_2e0->
                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
              FVar45 = DispatchSplit<9>::operator()
                                 ((DispatchSplit<9> *)&local_328,&local_318,local_318.bits >> 0x30);
              bVar37 = true;
              local_368._0_4_ = auVar38._0_4_;
              auVar38 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_368._0_4_)),ZEXT416(0));
              if (auVar38._0_4_ <= FVar45) {
                fVar42 = 1.0 - auVar38._0_4_;
                bVar37 = false;
                auVar52._4_4_ = fVar42;
                auVar52._0_4_ = fVar42;
                auVar52._8_4_ = fVar42;
                auVar52._12_4_ = fVar42;
                _local_308 = vdivps_avx(_local_308,auVar52);
              }
            }
            else {
              bVar37 = false;
            }
          }
        }
      }
    }
    iVar26 = iVar27;
    if (bVar37) {
      lVar33 = (long)iVar26;
      *(long *)(in_FS_OFFSET + -0x278) = *(long *)(in_FS_OFFSET + -0x278) + 1;
      *(long *)(in_FS_OFFSET + -0x280) = *(long *)(in_FS_OFFSET + -0x280) + lVar33;
      lVar31 = *(long *)(in_FS_OFFSET + -0x6c0);
      if (lVar33 <= *(long *)(in_FS_OFFSET + -0x6c0)) {
        lVar31 = lVar33;
      }
      if (lVar33 < *(long *)(in_FS_OFFSET + -0x6b8)) {
        lVar33 = *(long *)(in_FS_OFFSET + -0x6b8);
      }
      *(long *)(in_FS_OFFSET + -0x6c0) = lVar31;
      *(long *)(in_FS_OFFSET + -0x6b8) = lVar33;
      auVar38 = vshufpd_avx(_local_2f8,_local_2f8,1);
      SVar72.values.values._0_8_ = local_2f8;
      SVar72.values.values._8_8_ = auVar38._0_8_;
      return (SampledSpectrum)SVar72.values.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum PathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                   SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                   VisibleSurface *visibleSurf) const {
    // Declare local variables for _PathIntegrator::Li()_
    SampledSpectrum L(0.f), beta(1.f);
    int depth = 0;

    Float bsdfPDF, etaScale = 1;
    bool specularBounce = false, anyNonSpecularBounces = false;
    LightSampleContext prevIntrCtx;

    while (true) {
        // Find next path vertex and accumulate contribution
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        // Add emitted light at path vertex or from the environment
        if (!si) {
            // Incorporate emission from infinite lights for escaped ray
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (depth == 0 || specularBounce)
                    L += SafeDiv(beta * Le, lambda.PDF());
                else {
                    // Compute MIS weight for infinite light
                    Float lightPDF =
                        lightSampler.PDF(prevIntrCtx, light) *
                        light.PDF_Li(prevIntrCtx, ray.d, LightSamplingMode::WithMIS);
                    Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                    L += SafeDiv(beta * weight * Le, lambda.PDF());
                }
            }

            break;
        }
        // Incorporate emission from emissive surface hit by ray
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, lambda.PDF());
            else {
                // Compute MIS weight for area light
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF =
                    lightSampler.PDF(prevIntrCtx, areaLight) *
                    areaLight.PDF_Li(prevIntrCtx, ray.d, LightSamplingMode::WithMIS);
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                L += SafeDiv(beta * weight * Le, lambda.PDF());
            }
        }

        SurfaceInteraction &isect = si->intr;
        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Initialize _visibleSurf_ at first intersection
        if (depth == 0 && visibleSurf != nullptr) {
            // Estimate BSDF's albedo
            constexpr int nRhoSamples = 16;
            SampledSpectrum rho(0.f);
            for (int i = 0; i < nRhoSamples; ++i) {
                // Generate sample for hemispherical-directional reflectance
                Float uc = RadicalInverse(0, i + 1);
                Point2f u(RadicalInverse(1, i + 1), RadicalInverse(2, i + 1));

                // Estimate one term of $\rho_\roman{hd}$
                pstd::optional<BSDFSample> bs = bsdf.Sample_f(si->intr.wo, uc, u);
                if (bs)
                    rho += bs->f * AbsDot(bs->wi, si->intr.shading.n) / bs->pdf;
            }
            SampledSpectrum albedo = rho / nRhoSamples;

            *visibleSurf =
                VisibleSurface(si->intr, camera.GetCameraTransform(), albedo, lambda);
        }

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Sample direct illumination from the light sources
        if (bsdf.IsNonSpecular()) {
            ++totalPaths;
            SampledSpectrum Ld = SampleLd(isect, &bsdf, lambda, sampler);
            if (!Ld)
                ++zeroRadiancePaths;
            L += SafeDiv(beta * Ld, lambda.PDF());
        }

        // Sample BSDF to get new path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update path state variables for after surface scattering
        beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
        bsdfPDF = bs->pdfIsProportional ? bsdf.PDF(wo, bs->wi) : bs->pdf;
        DCHECK(!IsInf(beta.y(lambda)));
        specularBounce = bs->IsSpecular();
        anyNonSpecularBounces |= !bs->IsSpecular();
        if (bs->IsTransmission())
            etaScale *= Sqr(bs->eta);
        prevIntrCtx = si->intr;

        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);

        // Possibly terminate the path with Russian roulette
        SampledSpectrum rrBeta = beta * etaScale;
        if (rrBeta.MaxComponentValue() < 1 && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            beta /= 1 - q;
            DCHECK(!IsInf(beta.y(lambda)));
        }
    }
    ReportValue(pathLength, depth);
    return L;
}